

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_yaml.cpp
# Opt level: O3

ReaderTablesPtr Omega_h::yaml::ask_reader_tables(void)

{
  __shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  element_type *in_RDI;
  ReaderTablesPtr RVar3;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  Language *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  if (ask_reader_tables()::ptr == '\0') {
    ask_reader_tables();
    in_RDX._M_pi = extraout_RDX_02;
  }
  _Var2._M_pi = ask_reader_tables::ptr.
                super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if ((ask_reader_tables::ptr.
       super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
     ((ask_reader_tables::ptr.
       super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count == 0)) {
    ask_language();
    RVar3 = build_reader_tables((Omega_h *)&local_38,local_20);
    in_RDX = RVar3.super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    _Var1._M_refcount._M_pi = _Stack_30._M_pi;
    _Var1._M_ptr = local_38;
    local_38 = (element_type *)0x0;
    _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (ask_reader_tables::ptr.
        super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (ask_reader_tables::ptr.
                 super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      ask_reader_tables::ptr.
      super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2> = _Var1;
      in_RDX._M_pi = extraout_RDX;
      _Var1 = ask_reader_tables::ptr.
              super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>;
      if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
        in_RDX._M_pi = extraout_RDX_00;
        _Var1 = ask_reader_tables::ptr.
                super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>;
      }
    }
    ask_reader_tables::ptr.
    super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2> = _Var1;
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
      in_RDX._M_pi = extraout_RDX_01;
    }
    _Var2._M_pi = ask_reader_tables::ptr.
                  super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    (in_RDI->parser).grammar.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             ask_reader_tables::ptr.
             super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (in_RDI->parser).grammar.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var2._M_pi;
    if (_Var2._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00439728;
  }
  else {
    (in_RDI->parser).grammar.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             ask_reader_tables::ptr.
             super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (in_RDI->parser).grammar.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var2._M_pi;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
  }
LAB_00439728:
  RVar3.super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = in_RDX._M_pi;
  RVar3.super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ReaderTablesPtr)
         RVar3.super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ReaderTablesPtr ask_reader_tables() {
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wexit-time-destructors"
#endif
  static ReaderTablesPtr ptr;
#ifdef __clang__
#pragma clang diagnostic pop
#endif
  if (ptr.use_count() == 0) {
    ptr = build_reader_tables(*(yaml::ask_language()));
  }
  return ptr;
}